

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O0

Boolean Q_KerDefined(QMatrix *Q)

{
  LASErrIdType LVar1;
  Boolean local_14;
  Boolean KerDefined;
  QMatrix *Q_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((((Q->UnitRightKer == False) && (Q->RightKerCmp == (Real *)0x0)) ||
        (ABS(Q->MultiplD) < 2.2250738585072014e-307)) ||
       ((2.220446049250313e-15 <= ABS(Q->MultiplU / Q->MultiplD - 1.0) ||
        (2.220446049250313e-15 <= ABS(Q->MultiplL / Q->MultiplD - 1.0))))) {
      local_14 = False;
    }
    else {
      local_14 = True;
    }
  }
  else {
    local_14 = False;
  }
  return local_14;
}

Assistant:

Boolean Q_KerDefined(QMatrix *Q)
/* returns True if Q is singular and the null space has been defined
   otherwise False */ 
{
    Boolean KerDefined;

    if (LASResult() == LASOK) {
        if ((Q->UnitRightKer || Q->RightKerCmp != NULL) && !IsZero(Q->MultiplD)
	    && IsOne(Q->MultiplU / Q->MultiplD) && IsOne(Q->MultiplL / Q->MultiplD))
	    KerDefined = True;
	else
	    KerDefined = False;
    } else {
        KerDefined = (Boolean)0;
    }
    return(KerDefined);
}